

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O3

void google::protobuf::compiler::java::anon_unknown_6::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  FieldDescriptor *pFVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  FieldDescriptor FVar5;
  pointer pcVar6;
  bool bVar7;
  JavaType JVar8;
  Type TVar9;
  int iVar10;
  char *pcVar11;
  mapped_type *pmVar12;
  ClassNameResolver *name_resolver_00;
  char *pcVar13;
  long *plVar14;
  undefined8 *puVar15;
  uint uVar16;
  size_type *psVar17;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  int extraout_EDX_31;
  int extraout_EDX_32;
  int extraout_EDX_33;
  int extraout_EDX_34;
  int extraout_EDX_35;
  int extraout_EDX_36;
  int extraout_EDX_37;
  int extraout_EDX_38;
  int extraout_EDX_39;
  int extraout_EDX_40;
  int extraout_EDX_41;
  int extraout_EDX_42;
  int extraout_EDX_43;
  int extraout_EDX_44;
  int extraout_EDX_45;
  int extraout_EDX_46;
  int extraout_EDX_47;
  int extraout_EDX_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  _Alloc_hider _Var19;
  uint uVar20;
  undefined1 immutable;
  string capitalized_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  key_type local_158;
  undefined1 local_128 [32];
  key_type local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  uint local_c4;
  key_type local_c0;
  key_type local_a0;
  key_type local_80;
  uint local_5c;
  ClassNameResolver *local_58;
  key_type local_50;
  
  local_c4 = builderBitIndex;
  local_5c = messageBitIndex;
  local_58 = name_resolver;
  SetCommonFieldVariables(descriptor,info,variables);
  JVar8 = GetJavaType(descriptor);
  pcVar11 = PrimitiveTypeName(JVar8);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"type","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_158);
  pcVar13 = (char *)pmVar12->_M_string_length;
  strlen(pcVar11);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,pcVar13,(ulong)pcVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  pcVar11 = BoxedPrimitiveTypeName(JVar8);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"boxed_type","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_158);
  pcVar13 = (char *)pmVar12->_M_string_length;
  strlen(pcVar11);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,pcVar13,(ulong)pcVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  pcVar11 = KotlinTypeName(JVar8);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"kt_type","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_158);
  pcVar13 = (char *)pmVar12->_M_string_length;
  name_resolver_00 = (ClassNameResolver *)strlen(pcVar11);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,pcVar13,(ulong)pcVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"type","");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](variables,&local_158);
  paVar18 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"field_type","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_108);
  std::__cxx11::string::_M_assign((string *)pmVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar18) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (JVar8 < JAVATYPE_STRING) {
    pcVar13 = PrimitiveTypeName(JVar8);
    std::__cxx11::string::string((string *)&local_108,pcVar13,(allocator *)&local_e8);
    UnderscoresToCamelCase(&local_158,&local_108,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    std::operator+(&local_e8,"com.google.protobuf.Internal.",&local_158);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_e8);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108.field_2._8_8_ = plVar14[3];
      local_108._M_dataplus._M_p = (pointer)paVar18;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_108._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    paVar2 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"field_list_type","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    paVar3 = &local_e8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    std::operator+(&local_e8,"empty",&local_158);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_e8);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108.field_2._8_8_ = plVar14[3];
      local_108._M_dataplus._M_p = (pointer)paVar18;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_108._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"empty_list","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    std::operator+(&local_e8,"new",&local_158);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_e8);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108.field_2._8_8_ = plVar14[3];
      local_108._M_dataplus._M_p = (pointer)paVar18;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_108._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"create_list","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::operator+(&local_e8,"mutableCopy(",pmVar12);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_e8);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108.field_2._8_8_ = plVar14[3];
      local_108._M_dataplus._M_p = (pointer)paVar18;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_108._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    pFVar1 = (FieldDescriptor *)(local_128 + 0x10);
    local_128._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"mutable_copy_list","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_128);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_108);
    if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
      operator_delete((void *)local_128._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_e8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_e8);
    pcVar6 = (pmVar12->_M_dataplus)._M_p;
    local_108._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar6,pcVar6 + pmVar12->_M_string_length);
    std::__cxx11::string::append((char *)&local_108);
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name_make_immutable","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    pcVar6 = (pmVar12->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar6,pcVar6 + pmVar12->_M_string_length);
    std::__cxx11::string::append((char *)&local_e8);
    plVar14 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_e8,(ulong)local_158._M_dataplus._M_p);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108.field_2._8_8_ = plVar14[3];
      local_108._M_dataplus._M_p = (pointer)paVar18;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_108._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_128._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"repeated_get","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_128);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_108);
    if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
      operator_delete((void *)local_128._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    pcVar6 = (pmVar12->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar6,pcVar6 + pmVar12->_M_string_length);
    std::__cxx11::string::append((char *)&local_e8);
    plVar14 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_e8,(ulong)local_158._M_dataplus._M_p);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108.field_2._8_8_ = plVar14[3];
      local_108._M_dataplus._M_p = (pointer)paVar18;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_108._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_128._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"repeated_add","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_128);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_108);
    if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
      operator_delete((void *)local_128._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    pcVar6 = (pmVar12->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar6,pcVar6 + pmVar12->_M_string_length);
    std::__cxx11::string::append((char *)&local_e8);
    puVar15 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_158._M_dataplus._M_p);
    psVar17 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108.field_2._8_8_ = puVar15[3];
      local_108._M_dataplus._M_p = (pointer)paVar18;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_108._M_string_length = puVar15[1];
    *puVar15 = psVar17;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    local_128._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"repeated_set","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_128);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_108);
    if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
      operator_delete((void *)local_128._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    immutable = SUB81(local_58,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    _Var19._M_p = local_158._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_002f9f1c:
      operator_delete(_Var19._M_p);
    }
  }
  else {
    paVar2 = &local_e8.field_2;
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"boxed_type","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_e8);
    std::operator+(&local_108,"java.util.List<",pmVar12);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158.field_2._8_8_ = plVar14[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_158._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    paVar3 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"field_list_type","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar3) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"boxed_type","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_e8);
    std::operator+(&local_108,"new java.util.ArrayList<",pmVar12);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158.field_2._8_8_ = plVar14[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_158._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_c0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"create_list","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar3) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"boxed_type","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_128);
    std::operator+(&local_c0,"new java.util.ArrayList<",pmVar12);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_c0);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_e8.field_2._M_allocated_capacity = *psVar17;
      local_e8.field_2._8_4_ = (undefined4)plVar14[3];
      local_e8.field_2._12_4_ = *(undefined4 *)((long)plVar14 + 0x1c);
      local_e8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar17;
      local_e8._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_e8._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_a0);
    plVar14 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_e8,(ulong)(pmVar12->_M_dataplus)._M_p);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108.field_2._8_8_ = plVar14[3];
      local_108._M_dataplus._M_p = (pointer)paVar18;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_108._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158.field_2._8_8_ = plVar14[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_158._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"mutable_copy_list","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_80);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    immutable = SUB81(local_58,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar3) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_);
    }
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"empty_list","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_158);
    name_resolver_00 = (ClassNameResolver *)0x21;
    std::__cxx11::string::_M_replace((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,0x423857);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    pcVar6 = (pmVar12->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar6,pcVar6 + pmVar12->_M_string_length);
    std::__cxx11::string::append((char *)&local_e8);
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_128);
    plVar14 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_e8,(ulong)(pmVar12->_M_dataplus)._M_p);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108.field_2._8_8_ = plVar14[3];
      local_108._M_dataplus._M_p = (pointer)paVar18;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_108._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158.field_2._8_8_ = plVar14[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_158._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"name_make_immutable","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_128._0_8_ != (FieldDescriptor *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar3) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_108._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_108);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    pcVar6 = (pmVar12->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pcVar6,pcVar6 + pmVar12->_M_string_length);
    std::__cxx11::string::append((char *)&local_158);
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"repeated_get","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_e8);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    local_108._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_108);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    pcVar6 = (pmVar12->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pcVar6,pcVar6 + pmVar12->_M_string_length);
    std::__cxx11::string::append((char *)&local_158);
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"repeated_add","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_e8);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    local_108._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_108);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    pcVar6 = (pmVar12->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pcVar6,pcVar6 + pmVar12->_M_string_length);
    std::__cxx11::string::append((char *)&local_158);
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"repeated_set","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_e8);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    _Var19._M_p = local_108._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar18) goto LAB_002f9f1c;
  }
  DefaultValue_abi_cxx11_
            (&local_158,(java *)descriptor,(FieldDescriptor *)0x1,(bool)immutable,name_resolver_00);
  local_108._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"default","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_108);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar18) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  bVar7 = IsDefaultValueJavaDefault(descriptor);
  if (bVar7) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
  }
  else {
    DefaultValue_abi_cxx11_
              (&local_108,(java *)descriptor,(FieldDescriptor *)0x1,(bool)immutable,name_resolver_00
              );
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,0x3dd936);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    psVar17 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158.field_2._8_8_ = puVar15[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_158._M_string_length = puVar15[1];
    *puVar15 = psVar17;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"default_init","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_e8);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((!bVar7) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar18)) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  pcVar11 = GetCapitalizedType(descriptor,true);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"capitalized_type","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_158);
  pcVar13 = (char *)pmVar12->_M_string_length;
  strlen(pcVar11);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,pcVar13,(ulong)pcVar11);
  paVar18 = &local_158.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar18) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  iVar10 = *(int *)(descriptor + 4);
  bVar7 = FieldDescriptor::is_packed(descriptor);
  uVar16 = 2;
  if (!bVar7) {
    if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
      local_c0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_128._0_8_ = descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)&local_c0,
                 (FieldDescriptor **)local_128);
    }
    uVar16 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                      (ulong)(byte)descriptor[2] * 4);
  }
  local_158._M_dataplus._M_p = (pointer)paVar18;
  pcVar13 = FastInt32ToBufferLeft(iVar10 << 3 | uVar16,paVar18->_M_local_buf);
  local_158._M_string_length = (long)pcVar13 - (long)paVar18;
  paVar18 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,local_158._M_dataplus._M_p,
             local_158._M_dataplus._M_p + local_158._M_string_length);
  paVar2 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"tag","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar18) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  iVar10 = *(int *)(descriptor + 4);
  TVar9 = GetType(descriptor);
  uVar16 = iVar10 * 8 + 1;
  iVar10 = 0x1f;
  if (uVar16 != 0) {
    for (; uVar16 >> iVar10 == 0; iVar10 = iVar10 + -1) {
    }
  }
  paVar3 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar3;
  pcVar13 = FastUInt64ToBufferLeft
                      ((ulong)(iVar10 * 9 + 0x49U >> 6) << (TVar9 == TYPE_GROUP),
                       paVar3->_M_local_buf);
  local_158._M_string_length = (long)pcVar13 - (long)paVar3;
  local_e8._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,local_158._M_dataplus._M_p,
             local_158._M_dataplus._M_p + local_158._M_string_length);
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"tag_size","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar18) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  JVar8 = GetJavaType(descriptor);
  bVar7 = IsReferenceType(JVar8);
  if (bVar7) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"null_check","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_158);
    std::__cxx11::string::_M_replace((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,0x4238c3);
  }
  else {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"null_check","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_158);
    std::__cxx11::string::_M_replace((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,0x3d75d9);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  pcVar13 = "";
  if (*(char *)(*(long *)(descriptor + 0x38) + 0x4e) != '\0') {
    pcVar13 = "@java.lang.Deprecated ";
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"deprecation","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_158);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,(ulong)pcVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  cVar4 = *(char *)(*(long *)(descriptor + 0x38) + 0x4e);
  if (cVar4 == '\x01') {
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::operator+(&local_e8,"@kotlin.Deprecated(message = \"Field ",pmVar12);
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    psVar17 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158.field_2._8_8_ = puVar15[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_158._M_string_length = puVar15[1];
    *puVar15 = psVar17;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
  }
  else {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
  }
  pFVar1 = (FieldDescriptor *)(local_128 + 0x10);
  local_128._0_8_ = pFVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"kt_deprecation","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_128);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
  if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
    operator_delete((void *)local_128._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  uVar16 = local_5c;
  if (cVar4 != '\0') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  TVar9 = GetType(descriptor);
  iVar10 = FixedSize(TVar9);
  paVar18 = &local_158.field_2;
  if (iVar10 != -1) {
    local_158._M_dataplus._M_p = (pointer)paVar18;
    pcVar13 = FastInt32ToBufferLeft(iVar10,paVar18->_M_local_buf);
    local_158._M_string_length = (long)pcVar13 - (long)paVar18;
    local_128._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,local_158._M_dataplus._M_p,
               local_158._M_dataplus._M_p + local_158._M_string_length);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"fixed_size","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  paVar18 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"on_changed","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_158);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,0x4194ab);
  iVar10 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar18) {
    operator_delete(local_158._M_dataplus._M_p);
    iVar10 = extraout_EDX_00;
  }
  if (((~(byte)descriptor[1] & 0x60) != 0) &&
     ((((byte)descriptor[1] & 2) != 0 || (*(char *)(*(long *)(descriptor + 0x10) + 0x3a) == '\x02'))
     )) {
    GenerateGetBit_abi_cxx11_(&local_158,(java *)(ulong)uVar16,iVar10);
    local_128._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"get_has_field_bit_message","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_128);
    uVar20 = local_c4;
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    iVar10 = extraout_EDX_01;
    if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
      operator_delete((void *)local_128._0_8_);
      iVar10 = extraout_EDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar18) {
      operator_delete(local_158._M_dataplus._M_p);
      iVar10 = extraout_EDX_03;
    }
    GenerateGetBit_abi_cxx11_(&local_158,(java *)(ulong)uVar20,iVar10);
    local_128._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"get_has_field_bit_builder","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_128);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    iVar10 = extraout_EDX_04;
    if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
      operator_delete((void *)local_128._0_8_);
      iVar10 = extraout_EDX_05;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar18) {
      operator_delete(local_158._M_dataplus._M_p);
      iVar10 = extraout_EDX_06;
    }
    GenerateSetBit_abi_cxx11_((string *)local_128,(java *)(ulong)uVar16,iVar10);
    plVar14 = (long *)std::__cxx11::string::append((char *)local_128);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158.field_2._8_8_ = plVar14[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_158._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    paVar18 = &local_a0.field_2;
    local_a0._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"set_has_field_bit_message","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    iVar10 = extraout_EDX_07;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar18) {
      operator_delete(local_a0._M_dataplus._M_p);
      iVar10 = extraout_EDX_08;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
      iVar10 = extraout_EDX_09;
    }
    if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
      operator_delete((void *)local_128._0_8_);
      iVar10 = extraout_EDX_10;
    }
    GenerateSetBit_abi_cxx11_((string *)local_128,(java *)(ulong)local_c4,iVar10);
    plVar14 = (long *)std::__cxx11::string::append((char *)local_128);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158.field_2._8_8_ = plVar14[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_158._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_a0._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"set_has_field_bit_builder","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    iVar10 = extraout_EDX_11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar18) {
      operator_delete(local_a0._M_dataplus._M_p);
      iVar10 = extraout_EDX_12;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
      iVar10 = extraout_EDX_13;
    }
    if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
      operator_delete((void *)local_128._0_8_);
      iVar10 = extraout_EDX_14;
    }
    GenerateClearBit_abi_cxx11_((string *)local_128,(java *)(ulong)local_c4,iVar10);
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)local_128);
    paVar2 = &local_158.field_2;
    psVar17 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158.field_2._8_8_ = puVar15[3];
      local_158._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_158._M_string_length = puVar15[1];
    *puVar15 = psVar17;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    local_a0._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"clear_has_field_bit_builder","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    iVar10 = extraout_EDX_15;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar18) {
      operator_delete(local_a0._M_dataplus._M_p);
      iVar10 = extraout_EDX_16;
    }
    uVar20 = local_c4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar2) {
      operator_delete(local_158._M_dataplus._M_p);
      iVar10 = extraout_EDX_17;
    }
    if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
      operator_delete((void *)local_128._0_8_);
      iVar10 = extraout_EDX_18;
    }
    GenerateGetBit_abi_cxx11_(&local_158,(java *)(ulong)uVar16,iVar10);
    local_128._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"is_field_present_message","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_128);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    iVar10 = extraout_EDX_19;
    if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
      operator_delete((void *)local_128._0_8_);
      iVar10 = extraout_EDX_20;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar2) {
      operator_delete(local_158._M_dataplus._M_p);
      iVar10 = extraout_EDX_21;
    }
    goto LAB_002faecc;
  }
  local_158._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"set_has_field_bit_message","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_158);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,0x3d75d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar18) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  local_158._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"set_has_field_bit_builder","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_158);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,0x3d75d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar18) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  local_158._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"clear_has_field_bit_builder","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_158);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,0x3d75d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar18) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
    local_158._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_128._0_8_ = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)&local_158,
               (FieldDescriptor **)local_128);
  }
  FVar5 = descriptor[2];
  paVar18 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar18;
  if (FVar5 == (FieldDescriptor)0x1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   "java.lang.Double.doubleToRawLongBits(",pmVar12);
    puVar15 = (undefined8 *)std::__cxx11::string::append(local_128);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    psVar17 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158.field_2._8_8_ = puVar15[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_158._M_string_length = puVar15[1];
    *puVar15 = psVar17;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"is_field_present_message","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_80);
LAB_002fae6e:
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    iVar10 = extraout_EDX_22;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
      iVar10 = extraout_EDX_23;
    }
    uVar20 = local_c4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
      iVar10 = extraout_EDX_24;
    }
  }
  else {
    if (FVar5 == (FieldDescriptor)0x2) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"name","");
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     "java.lang.Float.floatToRawIntBits(",pmVar12);
      puVar15 = (undefined8 *)std::__cxx11::string::append(local_128);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      psVar17 = puVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_158.field_2._M_allocated_capacity = *psVar17;
        local_158.field_2._8_8_ = puVar15[3];
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar17;
        local_158._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_158._M_string_length = puVar15[1];
      *puVar15 = psVar17;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"is_field_present_message","");
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_80);
      goto LAB_002fae6e;
    }
    if (FVar5 == (FieldDescriptor)0xc) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"name","");
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     "!",pmVar12);
      plVar14 = (long *)std::__cxx11::string::append(local_128);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      psVar17 = (size_type *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_158.field_2._M_allocated_capacity = *psVar17;
        local_158.field_2._8_8_ = plVar14[3];
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar17;
        local_158._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_158._M_string_length = plVar14[1];
      *plVar14 = (long)psVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"is_field_present_message","");
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_80);
      goto LAB_002fae6e;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"name","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_a0);
    pcVar6 = (pmVar12->_M_dataplus)._M_p;
    local_128._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,pcVar6,pcVar6 + pmVar12->_M_string_length);
    std::__cxx11::string::append(local_128);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"default","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_80);
    puVar15 = (undefined8 *)
              std::__cxx11::string::_M_append(local_128,(ulong)(pmVar12->_M_dataplus)._M_p);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    psVar17 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158.field_2._8_8_ = puVar15[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar17;
      local_158._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_158._M_string_length = puVar15[1];
    *puVar15 = psVar17;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"is_field_present_message","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_50);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
    iVar10 = extraout_EDX_45;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      iVar10 = extraout_EDX_46;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
      iVar10 = extraout_EDX_47;
    }
    uVar20 = local_c4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
      iVar10 = extraout_EDX_48;
      uVar20 = local_c4;
    }
  }
  if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
    operator_delete((void *)local_128._0_8_);
    iVar10 = extraout_EDX_25;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar18) {
    operator_delete(local_a0._M_dataplus._M_p);
    iVar10 = extraout_EDX_26;
  }
LAB_002faecc:
  paVar18 = &local_158.field_2;
  GenerateGetBit_abi_cxx11_(&local_158,(java *)(ulong)uVar20,iVar10);
  local_128._0_8_ = pFVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"get_mutable_bit_builder","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_128);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
  iVar10 = extraout_EDX_27;
  if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
    operator_delete((void *)local_128._0_8_);
    iVar10 = extraout_EDX_28;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar18) {
    operator_delete(local_158._M_dataplus._M_p);
    iVar10 = extraout_EDX_29;
  }
  GenerateSetBit_abi_cxx11_(&local_158,(java *)(ulong)uVar20,iVar10);
  local_128._0_8_ = pFVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"set_mutable_bit_builder","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_128);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
  iVar10 = extraout_EDX_30;
  if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
    operator_delete((void *)local_128._0_8_);
    iVar10 = extraout_EDX_31;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar18) {
    operator_delete(local_158._M_dataplus._M_p);
    iVar10 = extraout_EDX_32;
  }
  GenerateClearBit_abi_cxx11_(&local_158,(java *)(ulong)uVar20,iVar10);
  local_128._0_8_ = pFVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,"clear_mutable_bit_builder","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_128);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
  iVar10 = extraout_EDX_33;
  if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
    operator_delete((void *)local_128._0_8_);
    iVar10 = extraout_EDX_34;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar18) {
    operator_delete(local_158._M_dataplus._M_p);
    iVar10 = extraout_EDX_35;
  }
  GenerateGetBitMutableLocal_abi_cxx11_(&local_158,(java *)(ulong)uVar20,iVar10);
  local_128._0_8_ = pFVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"get_mutable_bit_parser","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_128);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
  iVar10 = extraout_EDX_36;
  if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
    operator_delete((void *)local_128._0_8_);
    iVar10 = extraout_EDX_37;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar18) {
    operator_delete(local_158._M_dataplus._M_p);
    iVar10 = extraout_EDX_38;
  }
  GenerateSetBitMutableLocal_abi_cxx11_(&local_158,(java *)(ulong)uVar20,iVar10);
  local_128._0_8_ = pFVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"set_mutable_bit_parser","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_128);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
  iVar10 = extraout_EDX_39;
  if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
    operator_delete((void *)local_128._0_8_);
    iVar10 = extraout_EDX_40;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar18) {
    operator_delete(local_158._M_dataplus._M_p);
    iVar10 = extraout_EDX_41;
  }
  GenerateGetBitFromLocal_abi_cxx11_(&local_158,(java *)(ulong)uVar20,iVar10);
  local_128._0_8_ = pFVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,"get_has_field_bit_from_local","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_128);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
  iVar10 = extraout_EDX_42;
  if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
    operator_delete((void *)local_128._0_8_);
    iVar10 = extraout_EDX_43;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar18) {
    operator_delete(local_158._M_dataplus._M_p);
    iVar10 = extraout_EDX_44;
  }
  GenerateSetBitToLocal_abi_cxx11_(&local_158,(java *)(ulong)uVar16,iVar10);
  local_128._0_8_ = pFVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,"set_has_field_bit_to_local","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_128);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_158);
  if ((FieldDescriptor *)local_128._0_8_ != pFVar1) {
    operator_delete((void *)local_128._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar18) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           int messageBitIndex, int builderBitIndex,
                           const FieldGeneratorInfo* info,
                           ClassNameResolver* name_resolver,
                           std::map<std::string, std::string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);

  (*variables)["empty_list"] =
      "com.google.protobuf.GeneratedMessageLite.emptyProtobufList()";

  (*variables)["default"] = ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["default_init"] =
      "= " + ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["capitalized_type"] = "java.lang.String";
  (*variables)["tag"] =
      StrCat(static_cast<int32_t>(WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = StrCat(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  // We use `x.getClass()` as a null check because it generates less bytecode
  // than an `if (x == null) { throw ... }` statement.
  (*variables)["null_check"] =
      "  java.lang.Class<?> valueClass = value.getClass();\n";

  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  (*variables)["kt_deprecation"] =
      descriptor->options().deprecated()
          ? "@kotlin.Deprecated(message = \"Field " + (*variables)["name"] +
                " is deprecated\") "
          : "";
  (*variables)["required"] = descriptor->is_required() ? "true" : "false";

  if (HasHasbit(descriptor)) {
    // For singular messages and builders, one bit is used for the hasField bit.
    (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);

    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        GenerateSetBit(messageBitIndex) + ";";
    (*variables)["clear_has_field_bit_message"] =
        GenerateClearBit(messageBitIndex) + ";";

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["clear_has_field_bit_message"] = "";

    (*variables)["is_field_present_message"] =
        "!" + (*variables)["name"] + "_.isEmpty()";
  }

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);
}